

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *piVar3;
  float b;
  float a;
  float sigma;
  float mu;
  delim_c local_4c;
  delim_c local_4b;
  delim_c local_4a;
  delim_c local_49;
  result_type_conflict1 local_48;
  result_type_conflict1 local_44;
  result_type_conflict1 local_40;
  result_type_conflict1 local_3c;
  param_type local_38;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_38.mu_ = (result_type_conflict1)CONCAT31(local_38.mu_._1_3_,0x28);
  pbVar2 = utility::operator>>(in,(delim_c *)&local_38);
  piVar3 = std::istream::_M_extract<float>((float *)pbVar2);
  local_49.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_49);
  piVar3 = std::istream::_M_extract<float>((float *)pbVar2);
  local_4a.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_4a);
  piVar3 = std::istream::_M_extract<float>((float *)pbVar2);
  local_4b.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_4b);
  piVar3 = std::istream::_M_extract<float>((float *)pbVar2);
  local_4c.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_4c);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    local_38.mu_ = local_3c;
    local_38.sigma_ = local_40;
    local_38.a_ = local_44;
    local_38.b_ = local_48;
    local_38.Phi_a = 0.0;
    local_38.Phi_b = 1.0;
    truncated_normal_dist<float>::param_type::update_Phi(&local_38);
    P->Phi_a = local_38.Phi_a;
    P->Phi_b = local_38.Phi_b;
    P->mu_ = local_38.mu_;
    P->sigma_ = local_38.sigma_;
    P->a_ = local_38.a_;
    P->b_ = local_38.b_;
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t mu, sigma, a, b;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> mu >> utility::delim(' ') >> sigma >>
            utility::delim(' ') >> a >> utility::delim(' ') >> b >> utility::delim(')');
        if (in)
          P = param_type(mu, sigma, a, b);
        in.flags(flags);
        return in;
      }